

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_table_scan.cpp
# Opt level: O3

OperatorPartitionData * __thiscall
duckdb::PhysicalTableScan::GetPartitionData
          (OperatorPartitionData *__return_storage_ptr__,PhysicalTableScan *this,
          ExecutionContext *context,DataChunk *chunk,GlobalSourceState *gstate_p,
          LocalSourceState *lstate,OperatorPartitionInfo *partition_info)

{
  TableFunctionGetPartitionInput local_28;
  
  local_28.bind_data.ptr =
       (this->bind_data).
       super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  local_28.local_state.ptr = (LocalTableFunctionState *)lstate[1]._vptr_LocalSourceState;
  local_28.global_state.ptr =
       *(GlobalTableFunctionState **)&gstate_p[1].super_StateWithBlockableTasks;
  local_28.partition_info = partition_info;
  (*(this->function).get_partition_data)(__return_storage_ptr__,context->client,&local_28);
  return __return_storage_ptr__;
}

Assistant:

OperatorPartitionData PhysicalTableScan::GetPartitionData(ExecutionContext &context, DataChunk &chunk,
                                                          GlobalSourceState &gstate_p, LocalSourceState &lstate,
                                                          const OperatorPartitionInfo &partition_info) const {
	D_ASSERT(SupportsPartitioning(partition_info));
	D_ASSERT(function.get_partition_data);
	auto &gstate = gstate_p.Cast<TableScanGlobalSourceState>();
	auto &state = lstate.Cast<TableScanLocalSourceState>();
	TableFunctionGetPartitionInput input(bind_data.get(), state.local_state.get(), gstate.global_state.get(),
	                                     partition_info);
	return function.get_partition_data(context.client, input);
}